

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O0

void voc_parse_dict_lookup(voccxdef *ctx)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  long lVar3;
  voccxdef *p_00;
  objnum *p_01;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  objnum *list1_00;
  objnum *list2_00;
  ushort **ppuVar8;
  unsigned_long uVar9;
  long in_RDI;
  int i_1;
  typemap_t *mapp;
  int i;
  vocseadef search_ctx;
  uint len;
  char *p;
  vocwdef *v;
  uint curwordlen2;
  char *curword2;
  uint curwordlen;
  char *curword;
  int type_prop;
  int curtyp;
  int cnt2;
  int cnt1;
  objnum *list2;
  objnum *list1;
  uint typsiz;
  uchar *typp;
  uint wrdsiz;
  uchar *wrdp;
  runcxdef *rcx;
  uchar *save_sp;
  uint *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined2 in_stack_ffffffffffffff14;
  undefined1 in_stack_ffffffffffffff16;
  byte in_stack_ffffffffffffff17;
  objnum *objlist;
  voccxdef *ctx_00;
  int local_d4;
  typemap_t *local_d0;
  int local_c4;
  uint local_c0 [12];
  int in_stack_ffffffffffffff70;
  vocseadef *wrd2;
  vocwdef *in_stack_ffffffffffffff80;
  int len_00;
  undefined4 in_stack_ffffffffffffff88;
  voccxdef *ctx_01;
  vocseadef *search_ctx_00;
  int local_50;
  int local_4c;
  
  puVar1 = *(undefined8 **)(in_RDI + 0x10);
  uVar2 = *(undefined8 *)(in_RDI + 0x11b0);
  list1_00 = (objnum *)
             voc_stk_alo((voccxdef *)
                         CONCAT17(in_stack_ffffffffffffff17,
                                  CONCAT16(in_stack_ffffffffffffff16,
                                           CONCAT24(in_stack_ffffffffffffff14,
                                                    in_stack_ffffffffffffff10))),
                         (uint)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  list2_00 = (objnum *)
             voc_stk_alo((voccxdef *)
                         CONCAT17(in_stack_ffffffffffffff17,
                                  CONCAT16(in_stack_ffffffffffffff16,
                                           CONCAT24(in_stack_ffffffffffffff14,
                                                    in_stack_ffffffffffffff10))),
                         (uint)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  lVar3 = puVar1[4];
  puVar1[4] = lVar3 + -0x10;
  if (*(char *)(lVar3 + -0x10) != '\a') {
    *(undefined4 *)(*(long *)*puVar1 + 0x68) = 0;
    runsign((runcxdef *)
            CONCAT17(in_stack_ffffffffffffff17,
                     CONCAT16(in_stack_ffffffffffffff16,
                              CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10))),
            (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  }
  p_00 = *(voccxdef **)(puVar1[4] + 8);
  ctx_00 = p_00;
  iVar4 = osrp2(p_00);
  lVar3 = puVar1[4];
  puVar1[4] = lVar3 + -0x10;
  if (*(char *)(lVar3 + -0x10) != '\a') {
    *(undefined4 *)(*(long *)*puVar1 + 0x68) = 0;
    runsign((runcxdef *)
            CONCAT17(in_stack_ffffffffffffff17,
                     CONCAT16(in_stack_ffffffffffffff16,
                              CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10))),
            (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  }
  p_01 = *(objnum **)(puVar1[4] + 8);
  objlist = p_01;
  iVar5 = osrp2(p_01);
  local_4c = 0;
  while (iVar4 != 2) {
    if (*(char *)((long)&p_00->voccxerr + 2) == '\x03') {
      wrd2 = (vocseadef *)((long)&p_00->voccxerr + 5);
      iVar6 = osrp2((void *)((long)&p_00->voccxerr + 3));
      iVar6 = iVar6 + -2;
      search_ctx_00 = wrd2;
      while( true ) {
        in_stack_ffffffffffffff17 = 0;
        if (iVar6 != 0) {
          in_stack_ffffffffffffff16 = false;
          if (*(byte *)&wrd2->v < 0x80) {
            ppuVar8 = __ctype_b_loc();
            in_stack_ffffffffffffff16 = ((*ppuVar8)[(int)(uint)*(byte *)&wrd2->v] & 0x2000) != 0;
          }
          in_stack_ffffffffffffff17 = in_stack_ffffffffffffff16 ^ 0xff;
        }
        len_00 = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
        if ((in_stack_ffffffffffffff17 & 1) == 0) break;
        wrd2 = (vocseadef *)((long)&wrd2->v + 1);
        iVar6 = iVar6 + -1;
      }
      if (iVar6 == 0) {
        ctx_01 = (voccxdef *)0x0;
        iVar7 = 0;
      }
      else {
        ctx_01 = (voccxdef *)((long)&wrd2->v + 1);
        iVar7 = iVar6 + -1;
      }
      if ((iVar5 != 2) && ((char)p_01[1] == '\x01')) {
        uVar9 = osrp4((void *)((long)p_01 + 3));
        local_c4 = 6;
        for (local_d0 = voc_parse_dict_lookup::typemap;
            (local_c4 != 0 && (((uint)uVar9 & local_d0->flag) == 0)); local_d0 = local_d0 + 1) {
          local_c4 = local_c4 + -1;
        }
      }
      local_50 = 0;
      in_stack_ffffffffffffff08 = local_c0;
      in_stack_ffffffffffffff80 =
           vocffw(ctx_01,(char *)CONCAT44(iVar7,in_stack_ffffffffffffff88),len_00,(char *)wrd2,iVar6
                  ,in_stack_ffffffffffffff70,search_ctx_00);
      while ((in_stack_ffffffffffffff80 != (vocwdef *)0x0 && (local_50 < 199))) {
        for (local_d4 = 0;
            (local_d4 < local_50 && (list2_00[local_d4] != in_stack_ffffffffffffff80->vocwobj));
            local_d4 = local_d4 + 1) {
        }
        if (local_d4 == local_50) {
          list2_00[local_50] = in_stack_ffffffffffffff80->vocwobj;
          local_50 = local_50 + 1;
        }
        in_stack_ffffffffffffff80 =
             vocfnw(ctx_01,(vocseadef *)CONCAT44(iVar7,in_stack_ffffffffffffff88));
      }
      list2_00[local_50] = 0xffff;
      if (local_4c == 0) {
        memcpy(list1_00,list2_00,(long)(local_50 + 1) << 1);
        local_4c = local_50;
      }
      else {
        local_4c = vocisect(list1_00,list2_00);
      }
      if (local_4c == 0) break;
    }
    lstadv((uchar **)
           CONCAT17(in_stack_ffffffffffffff17,
                    CONCAT16(in_stack_ffffffffffffff16,
                             CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10))),
           in_stack_ffffffffffffff08);
    if (iVar5 != 2) {
      lstadv((uchar **)
             CONCAT17(in_stack_ffffffffffffff17,
                      CONCAT16(in_stack_ffffffffffffff16,
                               CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10))),
             in_stack_ffffffffffffff08);
    }
  }
  voc_push_objlist(ctx_00,objlist,
                   CONCAT13(in_stack_ffffffffffffff17,
                            CONCAT12(in_stack_ffffffffffffff16,in_stack_ffffffffffffff14)));
  *(undefined8 *)(in_RDI + 0x11b0) = uVar2;
  return;
}

Assistant:

void voc_parse_dict_lookup(voccxdef *ctx)
{
    uchar *save_sp;
    runcxdef *rcx = ctx->voccxrun;
    uchar *wrdp;
    uint wrdsiz;
    uchar *typp;
    uint typsiz;
    objnum *list1;
    objnum *list2;
    int cnt1;
    int cnt2;

    /* enter our stack frame and allocate stack arrays */
    voc_enter(ctx, &save_sp);
    VOC_MAX_ARRAY(ctx, objnum, list1);
    VOC_MAX_ARRAY(ctx, objnum, list2);
    
    /* get the word list, and read and skip its size prefix */
    wrdp = runpoplst(rcx);
    wrdsiz = osrp2(wrdp) - 2;
    wrdp += 2;

    /* get the type list, and read and skip its size prefix */
    typp = runpoplst(rcx);
    typsiz = osrp2(typp) - 2;
    typp += 2;

    /* nothing in the main list yet */
    cnt1 = 0;

    /* go through the word list */
    while (wrdsiz > 0)
    {
        int curtyp;
        int type_prop;
        char *curword;
        uint curwordlen;
        char *curword2;
        uint curwordlen2;
        vocwdef *v;
        char *p;
        uint len;
        vocseadef  search_ctx;
        
        /* if this entry is a string, consider it */
        if (*wrdp == DAT_SSTRING)
        {
            /* get the current word's text string */
            curword = (char *)(wrdp + 3);
            curwordlen = osrp2(wrdp+1) - 2;

            /* check for an embedded space */
            for (p = curword, len = curwordlen ; len != 0 && !t_isspace(*p) ;
                 ++p, --len) ;
            if (len != 0)
            {
                /* get the second word */
                curword2 = p + 1;
                curwordlen2 = len - 1;

                /* truncate the first word accordingly */
                curwordlen -= len;
            }
            else
            {
                /* no embedded space -> no second word */
                curword2 = 0;
                curwordlen2 = 0;
            }

            /* presume we won't find a valid type property */
            type_prop = PRP_INVALID;

            /* 
             *   get this type entry, if there's another entry in the
             *   list, and it's of the appropriate type 
             */
            if (typsiz > 0 && *typp == DAT_NUMBER)
            {
                /*
                 *   Figure out what type property we'll be using.  We'll
                 *   consider only one meaning for each word, and we'll
                 *   arbitrarily pick one if the type code has more than
                 *   one type, because we expect the caller to provide
                 *   exactly one type per word.  
                 */
                int i;
                struct typemap_t
                {
                    int flag;
                    int prop;
                };
                static struct typemap_t typemap[] =
                {
                    { VOCT_ARTICLE, PRP_ARTICLE },
                    { VOCT_ADJ,     PRP_ADJ },
                    { VOCT_NOUN,    PRP_NOUN },
                    { VOCT_PREP,    PRP_PREP },
                    { VOCT_VERB,    PRP_VERB },
                    { VOCT_PLURAL,  PRP_PLURAL }
                };
                struct typemap_t *mapp;

                /* get the type */
                curtyp = (int)osrp4(typp+1);

                /* search for a type */
                for (mapp = typemap, i = sizeof(typemap)/sizeof(typemap[0]) ;
                     i != 0 ; ++mapp, --i)
                {
                    /* if this flag is set, use this type property */
                    if ((curtyp & mapp->flag) != 0)
                    {
                        /* use this one */
                        type_prop = mapp->prop;
                        break;
                    }
                }
            }

            /* nothing in the new list yet */
            cnt2 = 0;

            /* scan for matching words */
            for (v = vocffw(ctx, curword, curwordlen, curword2, curwordlen2,
                            type_prop, &search_ctx) ;
                 v != 0 ;
                 v = vocfnw(ctx, &search_ctx))
            {
                int i;
                
                /* make sure we have room in our list */
                if (cnt2 >= VOCMAXAMBIG - 1)
                    break;

                /* make sure that this entry isn't already in our list */
                for (i = 0 ; i < cnt2 ; ++i)
                {
                    /* if this entry matches, stop looking */
                    if (list2[i] == v->vocwobj)
                        break;
                }

                /* if it's not already in the list, add it now */
                if (i == cnt2)
                {
                    /* add it to our list */
                    list2[cnt2++] = v->vocwobj;
                }
            }

            /* terminate the list */
            list2[cnt2] = MCMONINV;

            /* 
             *   if there's nothing in the first list, simply copy this
             *   into the first list; otherwise, intersect the two lists 
             */
            if (cnt1 == 0)
            {
                /* this is the first list -> copy it into the main list */
                memcpy(list1, list2, (cnt2+1)*sizeof(list2[0]));
                cnt1 = cnt2;
            }
            else
            {
                /* intersect the two lists */
                cnt1 = vocisect(list1, list2);
            }

            /* 
             *   if there's nothing in the result list now, there's no
             *   need to look any further, because further intersection
             *   will yield nothing 
             */
            if (cnt1 == 0)
                break;
        }
        
        /* advance the word list */
        lstadv(&wrdp, &wrdsiz);

        /* if there's anything left in the type list, advance it as well */
        if (typsiz > 0)
            lstadv(&typp, &typsiz);
    }

    /* push the result list */
    voc_push_objlist(ctx, list1, cnt1);

    /* exit our stack frame */
    voc_leave(ctx, save_sp);
}